

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall draco::ObjEncoder::GetSubObjects(ObjEncoder *this)

{
  GeometryMetadata *this_00;
  _Alloc_hider _Var1;
  ObjEncoder *pOVar2;
  AttributeMetadata *pAVar3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  PointAttribute *pPVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *__range1;
  bool bVar7;
  int value;
  string local_78;
  ObjEncoder *local_58;
  string local_50;
  
  this_00 = (this->in_point_cloud_->metadata_)._M_t.
            super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
            .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  bVar7 = true;
  if (this_00 != (GeometryMetadata *)0x0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sub_obj","");
    pAVar3 = GeometryMetadata::GetAttributeMetadataByStringEntry(this_00,&local_78,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (pAVar3 != (AttributeMetadata *)0x0) {
      local_58 = this;
      std::
      _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->sub_obj_id_to_name_)._M_h);
      p_Var5 = (pAVar3->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left;
      _Var1._M_p = local_78._M_dataplus._M_p;
      pOVar2 = local_58;
      while (local_58 = pOVar2,
            (_Rb_tree_header *)p_Var5 !=
            &(pAVar3->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header) {
        local_78._M_dataplus._M_p = _Var1._M_p & 0xffffffff00000000;
        if ((long)p_Var5[2]._M_parent - (long)*(undefined4 **)(p_Var5 + 2) == 4) {
          local_78._M_dataplus._M_p._4_4_ = (undefined4)((ulong)_Var1._M_p >> 0x20);
          local_78._M_dataplus._M_p._0_4_ = **(undefined4 **)(p_Var5 + 2);
          pmVar4 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->sub_obj_id_to_name_,(key_type *)&local_78);
          std::__cxx11::string::_M_assign((string *)pmVar4);
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        _Var1._M_p = local_78._M_dataplus._M_p;
        pOVar2 = local_58;
      }
      local_78._M_dataplus._M_p = _Var1._M_p;
      pPVar6 = PointCloud::GetAttributeByUniqueId(pOVar2->in_point_cloud_,pAVar3->att_unique_id_);
      pOVar2->sub_obj_att_ = pPVar6;
      if ((pPVar6 == (PointAttribute *)0x0) || (pPVar6->num_unique_entries_ == 0)) {
        bVar7 = false;
      }
      else {
        bVar7 = (pPVar6->super_GeometryAttribute).num_components_ == '\x01';
      }
    }
  }
  return bVar7;
}

Assistant:

bool ObjEncoder::GetSubObjects() {
  const GeometryMetadata *pc_metadata = in_point_cloud_->GetMetadata();
  if (!pc_metadata) {
    return true;
  }
  const AttributeMetadata *sub_obj_metadata =
      pc_metadata->GetAttributeMetadataByStringEntry("name", "sub_obj");
  if (!sub_obj_metadata) {
    return true;
  }
  sub_obj_id_to_name_.clear();
  for (const auto &entry : sub_obj_metadata->entries()) {
    // Sub-object id must be int.
    int value = 0;
    if (!entry.second.GetValue(&value)) {
      continue;
    }
    sub_obj_id_to_name_[value] = entry.first;
  }
  sub_obj_att_ = in_point_cloud_->GetAttributeByUniqueId(
      sub_obj_metadata->att_unique_id());
  if (sub_obj_att_ == nullptr || sub_obj_att_->size() == 0 ||
      sub_obj_att_->num_components() != 1) {
    return false;
  }
  return true;
}